

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O0

void divsufsortxx::substring::insertionsort<char*,bitmap::BitmapArray<long>::iterator>
               (char *T,iterator PA,iterator first,iterator last,value_type depth)

{
  iterator p1;
  bool bVar1;
  iterator *this;
  long lVar2;
  ulong uVar3;
  iterator iVar4;
  reference rVar5;
  iterator iVar6;
  int r;
  value_type t;
  iterator b;
  iterator a;
  value_reference *in_stack_fffffffffffffe98;
  value_reference *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  pos_type depth_00;
  BitmapArray<long> *pBVar7;
  BitmapArray<long> *pBVar8;
  BitmapArray<long> *pBVar9;
  iterator local_70;
  int local_5c;
  value_reference *local_58;
  iterator local_50;
  iterator local_40 [2];
  iterator local_20 [2];
  
  bitmap::BitmapArray<long>::iterator::iterator(local_40);
  bitmap::BitmapArray<long>::iterator::iterator(&local_50);
  local_70 = bitmap::BitmapArray<long>::iterator::operator-
                       ((iterator *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                        (difference_type)in_stack_fffffffffffffea0);
  bitmap::BitmapArray<long>::iterator::operator=(local_40,&local_70);
  do {
    bVar1 = bitmap::BitmapArray<long>::iterator::operator<(local_20,local_40);
    if (!bVar1) {
      return;
    }
    iVar4 = bitmap::BitmapArray<long>::iterator::operator-
                      ((iterator *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                       (difference_type)in_stack_fffffffffffffea0);
    pBVar9 = iVar4.array_;
    bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x118f4f);
    local_58 = (value_reference *)
               bitmap::BitmapArray::value_reference::operator_cast_to_long
                         ((value_reference *)0x118f6c);
    bitmap::BitmapArray<long>::iterator::operator=(&local_50,local_40);
    do {
      iVar4 = bitmap::BitmapArray<long>::iterator::operator+
                        ((iterator *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                         (difference_type)in_stack_fffffffffffffea0);
      pBVar7 = iVar4.array_;
      pBVar8 = (BitmapArray<long> *)iVar4.pos_;
      rVar5 = bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x118fc8);
      depth_00 = rVar5.pos_;
      bitmap::BitmapArray::value_reference::operator_cast_to_long((value_reference *)0x118fe5);
      iVar6 = bitmap::BitmapArray<long>::iterator::operator+
                        ((iterator *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                         (difference_type)in_stack_fffffffffffffea0);
      p1.pos_ = (pos_type)pBVar9;
      p1.array_ = pBVar8;
      iVar4.pos_ = (pos_type)pBVar7;
      iVar4.array_ = (BitmapArray<long> *)iVar6.pos_;
      local_5c = compare<char*,bitmap::BitmapArray<long>::iterator>
                           ((char *)iVar6.array_,p1,iVar4,depth_00);
      if (local_5c < 1) break;
      do {
        bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x119059);
        bitmap::BitmapArray<long>::iterator::operator-
                  ((iterator *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                   (difference_type)in_stack_fffffffffffffea0);
        bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x119092);
        bitmap::BitmapArray<long>::value_reference::operator=
                  (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        this = bitmap::BitmapArray<long>::iterator::operator++(&local_50);
        bVar1 = bitmap::BitmapArray<long>::iterator::operator<(this,(iterator *)&stack0x00000008);
        in_stack_fffffffffffffeaf = false;
        if (bVar1) {
          bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1190ed);
          lVar2 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                            ((value_reference *)0x119101);
          in_stack_fffffffffffffeaf = lVar2 < 0;
        }
      } while ((bool)in_stack_fffffffffffffeaf != false);
      bVar1 = bitmap::BitmapArray<long>::iterator::operator<=
                        ((iterator *)in_stack_fffffffffffffea0,(iterator *)in_stack_fffffffffffffe98
                        );
    } while (!bVar1);
    if (local_5c == 0) {
      bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x11914e);
      uVar3 = bitmap::BitmapArray::value_reference::operator_cast_to_long
                        ((value_reference *)0x119162);
      in_stack_fffffffffffffea0 = (value_reference *)(uVar3 ^ 0xffffffffffffffff);
      bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x119178);
      bitmap::BitmapArray<long>::value_reference::operator=
                (in_stack_fffffffffffffea0,(long)in_stack_fffffffffffffe98);
    }
    in_stack_fffffffffffffe98 = local_58;
    bitmap::BitmapArray<long>::iterator::operator-
              ((iterator *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
               (difference_type)in_stack_fffffffffffffea0);
    bitmap::BitmapArray<long>::iterator::operator*((iterator *)0x1191c3);
    bitmap::BitmapArray<long>::value_reference::operator=
              (in_stack_fffffffffffffea0,(long)in_stack_fffffffffffffe98);
    bitmap::BitmapArray<long>::iterator::operator--(local_40);
  } while( true );
}

Assistant:

void insertionsort(
    StringIterator_type T, const SAIterator_type PA, SAIterator_type first,
    SAIterator_type last,
    typename std::iterator_traits<SAIterator_type>::value_type depth) {
  SAIterator_type a, b;
  typename std::iterator_traits<SAIterator_type>::value_type t;
  int r;

  for (a = last - 1; first < a; --a) {
    for (t = *(a - 1), b = a; 0 < (r = compare(T, PA + t, PA + *b, depth));) {
      do {
        *(b - 1) = *b;
      } while ((++b < last) && (*b < 0));
      if (last <= b) {
        break;
      }
    }
    if (r == 0) {
      *b = ~*b;
    }
    *(b - 1) = t;
  }
}